

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::setTcopy
          (Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *this,
          Matrix<double,__1,__1,_0,__1,__1> *t)

{
  assign_op<double,_double> *func;
  Matrix<double,__1,__1,_0,__1,__1> *dst;
  assign_op<double,_double> local_12;
  assign_op<double,_double> local_11;
  
  dst = &this->Tcopy1;
  if (this->Tcopy == dst) {
    dst = &this->Tcopy2;
    func = &local_12;
  }
  else {
    func = &local_11;
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (dst,t,func);
  this->copyInit = true;
  this->Tcopy = dst;
  return dst;
}

Assistant:

const T &Signal<T, Time>::setTcopy(const T &t) {
  if (Tcopy == &Tcopy1) {
    Tcopy2 = t;
    copyInit = true;
    Tcopy = &Tcopy2;
    return Tcopy2;
  } else {
    Tcopy1 = t;
    copyInit = true;
    Tcopy = &Tcopy1;
    return Tcopy1;
  }
}